

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O2

int __thiscall KParser::_cmp_expr(KParser *this,int begin,BlockInfo *bi)

{
  TokenType TVar1;
  pointer pTVar2;
  uint uVar3;
  uint uVar4;
  string *this_00;
  allocator local_32b;
  allocator local_32a;
  allocator local_329;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string rightValue;
  string leftValue;
  BlockInfo local_a8;
  BlockInfo local_68;
  
  std::__cxx11::string::string
            ((string *)&leftValue,
             (string *)
             ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_start + begin));
  BlockInfo::BlockInfo(&local_68,bi);
  uVar3 = _add_expr(this,begin,&local_68);
  BlockInfo::~BlockInfo(&local_68);
  if ((int)uVar3 < 0) {
    uVar3 = 0xffffffff;
  }
  else {
    pTVar2 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar1 = pTVar2[uVar3].tokenType;
    if (0xfffffff9 < TVar1 - plus) {
      std::__cxx11::string::string((string *)&rightValue,(string *)(pTVar2 + (uVar3 + 1)));
      BlockInfo::BlockInfo(&local_a8,bi);
      uVar4 = _add_expr(this,uVar3 + 1,&local_a8);
      BlockInfo::~BlockInfo(&local_a8);
      if (-1 < (int)uVar4) {
        switch(TVar1) {
        case equal:
          std::__cxx11::string::string((string *)&local_108,"eq",&local_329);
          std::__cxx11::string::string((string *)&local_128,anon_var_dwarf_13527 + 0x22,&local_32a);
          std::__cxx11::string::string((string *)&local_148,anon_var_dwarf_13527 + 0x22,&local_32b);
          addCode(this,&local_108,&local_128,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_128);
          this_00 = &local_108;
          break;
        case not_equal:
          std::__cxx11::string::string((string *)&local_168,"neq",&local_329);
          std::__cxx11::string::string((string *)&local_188,anon_var_dwarf_13527 + 0x22,&local_32a);
          std::__cxx11::string::string((string *)&local_1a8,anon_var_dwarf_13527 + 0x22,&local_32b);
          addCode(this,&local_168,&local_188,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_188);
          this_00 = &local_168;
          break;
        case less_than:
          puts("lt!!");
          std::__cxx11::string::string((string *)&local_1c8,"lt",&local_329);
          std::__cxx11::string::string((string *)&local_1e8,anon_var_dwarf_13527 + 0x22,&local_32a);
          std::__cxx11::string::string((string *)&local_208,anon_var_dwarf_13527 + 0x22,&local_32b);
          addCode(this,&local_1c8,&local_1e8,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_1e8);
          this_00 = &local_1c8;
          break;
        case less_than_equal:
          puts("lte!!");
          std::__cxx11::string::string((string *)&local_228,"lte",&local_329);
          std::__cxx11::string::string((string *)&local_248,anon_var_dwarf_13527 + 0x22,&local_32a);
          std::__cxx11::string::string((string *)&local_268,anon_var_dwarf_13527 + 0x22,&local_32b);
          addCode(this,&local_228,&local_248,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_248);
          this_00 = &local_228;
          break;
        case greater_than:
          std::__cxx11::string::string((string *)&local_288,"gt",&local_329);
          std::__cxx11::string::string((string *)&local_2a8,anon_var_dwarf_13527 + 0x22,&local_32a);
          std::__cxx11::string::string((string *)&local_2c8,anon_var_dwarf_13527 + 0x22,&local_32b);
          addCode(this,&local_288,&local_2a8,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2a8);
          this_00 = &local_288;
          break;
        case greater_than_equal:
          std::__cxx11::string::string((string *)&local_2e8,"gte",&local_329);
          std::__cxx11::string::string((string *)&local_308,anon_var_dwarf_13527 + 0x22,&local_32a);
          std::__cxx11::string::string((string *)&local_328,anon_var_dwarf_13527 + 0x22,&local_32b);
          addCode(this,&local_2e8,&local_308,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          std::__cxx11::string::~string((string *)&local_308);
          this_00 = &local_2e8;
        }
        std::__cxx11::string::~string((string *)this_00);
        uVar3 = uVar4;
      }
      std::__cxx11::string::~string((string *)&rightValue);
    }
  }
  std::__cxx11::string::~string((string *)&leftValue);
  return uVar3;
}

Assistant:

int KParser::_cmp_expr(int begin,  BlockInfo bi) {
    int i = begin;
    int t;
    std::string leftValue = m_tokens[i].str;
    t = _add_expr(i, bi);
    if (t < 0) {
        return -1;
    }
    i = t;

    do {
        int tryI = i;
        auto tokenValue = m_tokens[tryI].tokenType;
        if(tokenValue != TokenType::equal 
           && tokenValue != TokenType::not_equal
           && tokenValue != TokenType::less_than
           && tokenValue != TokenType::less_than_equal
           && tokenValue != TokenType::greater_than
           && tokenValue != TokenType::greater_than_equal
           ) {
            break;
        }
        tryI++;
        std::string rightValue = m_tokens[tryI].str;
        t = _add_expr(tryI, bi);
        if (t < 0) {
            break;
        }
        // bi.addCode(leftValue);
        // bi.addCode(rightValue);
        if(tokenValue == TokenType::equal) {
            addCode("eq", "", "");
        } else if(tokenValue == TokenType::not_equal) {
            addCode("neq", "", "");
        }else if(tokenValue == TokenType::less_than) {
            printf("lt!!\n");
            addCode("lt", "", "");
        }else if(tokenValue == TokenType::less_than_equal) {
            printf("lte!!\n");
            addCode("lte", "", "");
        }else if(tokenValue == TokenType::greater_than) {
            addCode("gt", "", "");
        }else if(tokenValue == TokenType::greater_than_equal) {
            addCode("gte", "", "");
        } 
        i = t; 
    } while(0);
    return i;
}